

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  uint uVar1;
  uint uVar2;
  connectdata *pcVar3;
  CURLMcode CVar4;
  long *plVar5;
  Curl_tree *pCVar6;
  curl_llist_element *pcVar7;
  undefined7 in_register_00000031;
  Curl_easy *pCVar8;
  timeval now;
  Curl_tree *t;
  sigpipe_ignore pipe_st;
  Curl_tree *local_e0;
  int *local_d8;
  anon_union_8_2_5ad2d23e_for___sigaction_handler local_d0 [19];
  char local_38;
  
  now = curlx_tvnow();
  if ((int)CONCAT71(in_register_00000031,checkall) != 0) {
    CVar4 = curl_multi_perform(multi,running_handles);
    if (CVar4 == CURLM_BAD_HANDLE) {
      return CURLM_BAD_HANDLE;
    }
    for (pCVar8 = multi->easyp; pCVar8 != (Curl_easy *)0x0; pCVar8 = pCVar8->next) {
      singlesocket(multi,pCVar8);
    }
    return CVar4;
  }
  local_d8 = running_handles;
  if (s == -1) {
    (multi->timer_lastcall).tv_sec = 0;
    (multi->timer_lastcall).tv_usec = 0;
  }
  else {
    local_d0[0]._0_4_ = s;
    plVar5 = (long *)Curl_hash_pick(&multi->sockhash,local_d0,4);
    if (plVar5 != (long *)0x0) {
      pCVar8 = (Curl_easy *)*plVar5;
      if (pCVar8->magic != 0xc0dedbad) {
        return CURLM_INTERNAL_ERROR;
      }
      pcVar3 = pCVar8->easy_conn;
      if ((pcVar3 != (connectdata *)0x0) &&
         (((((ev_bitmask & 2U) != 0 && (pcVar3->send_pipe != (curl_llist *)0x0)) &&
           (pcVar7 = pcVar3->send_pipe->head, pcVar7 != (curl_llist_element *)0x0)) ||
          ((((ev_bitmask & 1U) != 0 && (pcVar3->recv_pipe != (curl_llist *)0x0)) &&
           (pcVar7 = pcVar3->recv_pipe->head, pcVar7 != (curl_llist_element *)0x0)))))) {
        pCVar8 = (Curl_easy *)pcVar7->ptr;
      }
      pcVar3 = pCVar8->easy_conn;
      if ((pcVar3 != (connectdata *)0x0) && ((pcVar3->handler->flags & 8) == 0)) {
        pcVar3->cselect_bits = ev_bitmask;
      }
      uVar1._0_1_ = (pCVar8->set).no_signal;
      uVar1._1_1_ = (pCVar8->set).global_dns_cache;
      uVar1._2_1_ = (pCVar8->set).tcp_nodelay;
      uVar1._3_1_ = (pCVar8->set).ignorecl;
      sigpipe_ignore((Curl_easy *)(ulong)uVar1,(sigpipe_ignore *)local_d0);
      CVar4 = multi_runsingle(multi,now,pCVar8);
      if (local_38 == '\0') {
        sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
      }
      pcVar3 = pCVar8->easy_conn;
      if ((pcVar3 != (connectdata *)0x0) && ((pcVar3->handler->flags & 8) == 0)) {
        pcVar3->cselect_bits = 0;
      }
      if (CVar4 < CURLM_BAD_HANDLE) {
        singlesocket(multi,pCVar8);
      }
      now = curlx_tvnow();
      goto LAB_00135ad1;
    }
  }
  CVar4 = CURLM_OK;
LAB_00135ad1:
  pCVar8 = (Curl_easy *)0x0;
  do {
    if (pCVar8 != (Curl_easy *)0x0) {
      uVar2._0_1_ = (pCVar8->set).no_signal;
      uVar2._1_1_ = (pCVar8->set).global_dns_cache;
      uVar2._2_1_ = (pCVar8->set).tcp_nodelay;
      uVar2._3_1_ = (pCVar8->set).ignorecl;
      sigpipe_ignore((Curl_easy *)(ulong)uVar2,(sigpipe_ignore *)local_d0);
      CVar4 = multi_runsingle(multi,now,pCVar8);
      if (local_38 == '\0') {
        sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
      }
      if (CVar4 < CURLM_BAD_HANDLE) {
        singlesocket(multi,pCVar8);
      }
    }
    pCVar6 = Curl_splaygetbest(now,multi->timetree,&local_e0);
    multi->timetree = pCVar6;
    if (local_e0 == (Curl_tree *)0x0) break;
    pCVar8 = (Curl_easy *)local_e0->payload;
    add_next_timeout(now,multi,pCVar8);
  } while (local_e0 != (Curl_tree *)0x0);
  *local_d8 = multi->num_alive;
  return CVar4;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t;
  struct timeval now = Curl_tvnow();

  if(checkall) {
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      data=multi->easyp;
      while(data) {
        singlesocket(multi, data);
        data = data->next;
      }
    }

    /* or should we fall-through and do the timer-based stuff? */
    return result;
  }
  else if(s != CURL_SOCKET_TIMEOUT) {

    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(!entry)
      /* Unmatched socket, we can't act on it but we ignore this fact.  In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      ;
    else {
      SIGPIPE_VARIABLE(pipe_st);

      data = entry->easy;

      if(data->magic != CURLEASY_MAGIC_NUMBER)
        /* bad bad bad bad bad bad bad */
        return CURLM_INTERNAL_ERROR;

      /* If the pipeline is enabled, take the handle which is in the head of
         the pipeline. If we should write into the socket, take the send_pipe
         head.  If we should read from the socket, take the recv_pipe head. */
      if(data->easy_conn) {
        if((ev_bitmask & CURL_POLL_OUT) &&
           data->easy_conn->send_pipe &&
           data->easy_conn->send_pipe->head)
          data = data->easy_conn->send_pipe->head->ptr;
        else if((ev_bitmask & CURL_POLL_IN) &&
                data->easy_conn->recv_pipe &&
                data->easy_conn->recv_pipe->head)
          data = data->easy_conn->recv_pipe->head->ptr;
      }

      if(data->easy_conn &&
         !(data->easy_conn->handler->flags & PROTOPT_DIRLOCK))
        /* set socket event bitmask if they're not locked */
        data->easy_conn->cselect_bits = ev_bitmask;

      sigpipe_ignore(data, &pipe_st);
      result = multi_runsingle(multi, now, data);
      sigpipe_restore(&pipe_st);

      if(data->easy_conn &&
         !(data->easy_conn->handler->flags & PROTOPT_DIRLOCK))
        /* clear the bitmask only if not locked */
        data->easy_conn->cselect_bits = 0;

      if(CURLM_OK >= result)
        /* get the socket(s) and check if the state has been changed since
           last */
        singlesocket(multi, data);

      /* Now we fall-through and do the timer-based stuff, since we don't want
         to force the user to have to deal with timeouts as long as at least
         one connection in fact has traffic. */

      data = NULL; /* set data to NULL again to avoid calling
                      multi_runsingle() in case there's no need to */
      now = Curl_tvnow(); /* get a newer time since the multi_runsingle() loop
                             may have taken some time */
    }
  }
  else {
    /* Asked to run due to time-out. Clear the 'lastcall' variable to force
       update_timer() to trigger a callback to the app again even if the same
       timeout is still the one to run after this call. That handles the case
       when the application asks libcurl to run the timeout prematurely. */
    memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));
  }

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process in the splay and 'data' will be re-assigned for every expired
   * handle we deal with.
   */
  do {
    /* the first loop lap 'data' can be NULL */
    if(data) {
      SIGPIPE_VARIABLE(pipe_st);

      sigpipe_ignore(data, &pipe_st);
      result = multi_runsingle(multi, now, data);
      sigpipe_restore(&pipe_st);

      if(CURLM_OK >= result)
        /* get the socket(s) and check if the state has been changed since
           last */
        singlesocket(multi, data);
    }

    /* Check if there's one (more) expired timer to deal with! This function
       extracts a matching node if there is one */

    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      data = t->payload; /* assign this for next loop */
      (void)add_next_timeout(now, multi, t->payload);
    }

  } while(t);

  *running_handles = multi->num_alive;
  return result;
}